

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::PathTypeHandlerBase::AddBlankFieldAt
          (PathTypeHandlerBase *this,PropertyId propertyId,PropertyIndex index,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  undefined4 *puVar4;
  
  if (DAT_015d6361 == '\x01') {
    uVar3 = (ushort)((((this->typePath).ptr)->data).ptr)->maxInitializedLength;
    if (uVar3 <= index) {
      if (uVar3 != index) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xc36,
                                    "(index == this->GetTypePath()->GetMaxInitializedLength())",
                                    "Adding properties out of order?");
        if (!bVar2) {
LAB_00dd5137:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      TypePath::AddBlankFieldAt
                ((this->typePath).ptr,index,
                 (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
      return;
    }
    InvalidateFixedFieldAt(this,propertyId,index,scriptContext);
    if (index + 1 == (uint)((((this->typePath).ptr)->data).ptr)->maxInitializedLength) {
      bVar2 = DynamicTypeHandler::ShouldFixAnyProperties();
      if ((!bVar2) &&
         ((((this->typePath).ptr)->singletonInstance).ptr !=
          (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xc49,"(HasSingletonInstanceOnlyIfNeeded())",
                                    "HasSingletonInstanceOnlyIfNeeded()");
        if (!bVar2) goto LAB_00dd5137;
        *puVar4 = 0;
      }
      (((this->typePath).ptr)->singletonInstance).ptr =
           (RecyclerWeakReference<Js::DynamicObject> *)0x0;
    }
  }
  return;
}

Assistant:

void PathTypeHandlerBase::AddBlankFieldAt(Js::PropertyId propertyId, Js::PropertyIndex index, ScriptContext* scriptContext)
    {
        if (!FixPropsOnPathTypes())
        {
            return;
        }

        if (index >= this->GetTypePath()->GetMaxInitializedLength())
        {
            // We are adding a property where no instance property has been set before.  We rely on properties being
            // added in order of indexes to be sure that we don't leave any uninitialized properties interspersed with
            // initialized ones, which could lead to incorrect behavior.  See comment in TypePath::Branch.
            AssertMsg(index == this->GetTypePath()->GetMaxInitializedLength(), "Adding properties out of order?");

            this->GetTypePath()->AddBlankFieldAt(index, GetPathLength());
        }
        else
        {
            InvalidateFixedFieldAt(propertyId, index, scriptContext);

            // We have now reached the most advanced instance along this path.  If this instance is not the singleton instance,
            // then the former singleton instance (if any) is no longer a singleton.  This instance could be the singleton
            // instance, if we just happen to set (overwrite) its last property.
            if (index + 1 == this->GetTypePath()->GetMaxInitializedLength())
            {
                // If we cleared the singleton instance while some fields remained fixed, the instance would
                // be collectible, and yet some code would expect to see values and call methods on it. We rely on the
                // fact that we always add properties to (pre-initialized) type handlers in the order they appear
                // on the type path.  By the time we reach the singleton instance, all fixed fields will have been invalidated.
                // Otherwise, some fields could remain fixed (or even uninitialized) and we would have to spin off a loop here
                // to invalidate any remaining fixed fields
                Assert(HasSingletonInstanceOnlyIfNeeded());
                this->GetTypePath()->ClearSingletonInstance();
            }

        }
    }